

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-port.cc
# Opt level: O0

char * testing::internal::StringFromGTestEnv(char *flag,char *default_value)

{
  char *name;
  char *in_RDX;
  char *local_68;
  char *value;
  string env_var;
  char *default_value_local;
  char *flag_local;
  
  env_var.field_2._8_8_ = default_value;
  FlagToEnvVar_abi_cxx11_((string *)&value,(internal *)flag,in_RDX);
  name = (char *)std::__cxx11::string::c_str();
  local_68 = posix::GetEnv(name);
  if (local_68 == (char *)0x0) {
    local_68 = (char *)env_var.field_2._8_8_;
  }
  std::__cxx11::string::~string((string *)&value);
  return local_68;
}

Assistant:

const char* StringFromGTestEnv(const char* flag, const char* default_value) {
#if defined(GTEST_GET_STRING_FROM_ENV_)
  return GTEST_GET_STRING_FROM_ENV_(flag, default_value);
#else
  const std::string env_var = FlagToEnvVar(flag);
  const char* const value = posix::GetEnv(env_var.c_str());
  return value == NULL ? default_value : value;
#endif  // defined(GTEST_GET_STRING_FROM_ENV_)
}